

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathFuncs.cpp
# Opt level: O2

float divide(float x,float y)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,x);
  poVar1 = std::operator<<(poVar1," / ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,y);
  std::endl<char,std::char_traits<char>>(poVar1);
  return x / y;
}

Assistant:

float
divide (float x, float y)
{
    std::cout << x << " / " << y << std::endl;
    return x / y;
}